

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSDDOMParser.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::XSDDOMParser::startElement
          (XSDDOMParser *this,XMLElementDecl *elemDecl,uint urlId,XMLCh *elemPrefix,
          RefVectorOf<xercesc_4_0::XMLAttr> *attrList,XMLSize_t attrCount,bool isEmpty,bool isRoot)

{
  XMLBufferMgr *pXVar1;
  XMLCh XVar2;
  XMLCh XVar3;
  int iVar4;
  XMLScanner *pXVar5;
  DOMDocumentImpl *pDVar6;
  DOMNode *pDVar7;
  int iVar8;
  uint uVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  XMLAttr *this_00;
  DOMAttr *attr;
  long *plVar10;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long lVar11;
  long *plVar12;
  XMLCh *pXVar13;
  XMLBuffer *pXVar14;
  long *plVar15;
  long *plVar16;
  ulong uVar17;
  XMLCh *pXVar18;
  DOMDocument *doc;
  XMLCh *pXVar19;
  ulong uVar20;
  XMLSize_t XVar21;
  int colonPos;
  DOMNode *local_58;
  int local_3c;
  XMLCh *local_38;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  
  iVar4 = this->fDepth;
  iVar8 = iVar4 + 1;
  this->fDepth = iVar8;
  if (this->fAnnotationDepth == -1) {
    pXVar13 = elemDecl->fElementName->fLocalPart;
    if (pXVar13 == L"annotation") {
LAB_00343f05:
      pXVar13 = XercesDOMParser::getURIText(&this->super_XercesDOMParser,urlId);
      if (pXVar13 == L"http://www.w3.org/2001/XMLSchema") {
LAB_00343f44:
        this->fAnnotationDepth = this->fDepth;
        startAnnotation(this,elemDecl,attrList,attrCount);
      }
      else {
        pXVar18 = L"http://www.w3.org/2001/XMLSchema";
        if (pXVar13 == (XMLCh *)0x0) {
LAB_00343f3e:
          if (*pXVar18 == L'\0') goto LAB_00343f44;
        }
        else {
          do {
            XVar2 = *pXVar13;
            if (XVar2 == L'\0') goto LAB_00343f3e;
            pXVar13 = pXVar13 + 1;
            XVar3 = *pXVar18;
            pXVar18 = pXVar18 + 1;
          } while (XVar2 == XVar3);
        }
      }
    }
    else {
      pXVar18 = L"annotation";
      if (pXVar13 == (XMLCh *)0x0) {
LAB_00343eff:
        if (*pXVar18 == L'\0') goto LAB_00343f05;
      }
      else {
        do {
          XVar2 = *pXVar13;
          if (XVar2 == L'\0') goto LAB_00343eff;
          pXVar13 = pXVar13 + 1;
          XVar3 = *pXVar18;
          pXVar18 = pXVar18 + 1;
        } while (XVar2 == XVar3);
      }
    }
  }
  else {
    if (iVar4 != this->fAnnotationDepth) {
      startAnnotationElement(this,elemDecl,attrList,attrCount);
      goto joined_r0x003443ab;
    }
    this->fInnerAnnotationDepth = iVar8;
    startAnnotationElement(this,elemDecl,attrList,attrCount);
  }
  pXVar5 = (this->super_XercesDOMParser).super_AbstractDOMParser.fScanner;
  if (pXVar5->fEmptyNamespaceId == urlId) {
    iVar8 = (*(this->super_XercesDOMParser).super_AbstractDOMParser.super_XMLDocumentHandler.
              _vptr_XMLDocumentHandler[0x2f])(this,0,elemDecl->fElementName->fLocalPart);
    local_58 = (DOMNode *)CONCAT44(extraout_var,iVar8);
  }
  else if ((elemPrefix == (XMLCh *)0x0) || (*elemPrefix == L'\0')) {
    pXVar13 = XMLScanner::getURIText(pXVar5,urlId);
    iVar8 = (*(this->super_XercesDOMParser).super_AbstractDOMParser.super_XMLDocumentHandler.
              _vptr_XMLDocumentHandler[0x2f])(this,pXVar13,elemDecl->fElementName->fLocalPart);
    local_58 = (DOMNode *)CONCAT44(extraout_var_01,iVar8);
  }
  else {
    pXVar1 = &(this->super_XercesDOMParser).super_AbstractDOMParser.fBufMgr;
    pXVar14 = XMLBufferMgr::bidOnBuffer(pXVar1);
    pXVar14->fIndex = 0;
    XMLBuffer::append(pXVar14,elemPrefix);
    if (pXVar14->fIndex == pXVar14->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar14,1);
    }
    XVar21 = pXVar14->fIndex;
    pXVar14->fIndex = XVar21 + 1;
    pXVar14->fBuffer[XVar21] = L':';
    XMLBuffer::append(pXVar14,elemDecl->fElementName->fLocalPart);
    pXVar13 = XMLScanner::getURIText
                        ((this->super_XercesDOMParser).super_AbstractDOMParser.fScanner,urlId);
    pXVar14->fBuffer[pXVar14->fIndex] = L'\0';
    iVar8 = (*(this->super_XercesDOMParser).super_AbstractDOMParser.super_XMLDocumentHandler.
              _vptr_XMLDocumentHandler[0x2f])(this,pXVar13);
    local_58 = (DOMNode *)CONCAT44(extraout_var_00,iVar8);
    XMLBufferMgr::releaseBuffer(pXVar1,pXVar14);
  }
  local_38 = elemPrefix;
  if (attrCount != 0) {
    XVar21 = 0;
    do {
      this_00 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                          (&attrList->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,XVar21);
      pXVar13 = this_00->fAttName->fLocalPart;
      if (pXVar13 == L"xmlns") {
LAB_003440f1:
        uVar9 = ((this->super_XercesDOMParser).super_AbstractDOMParser.fScanner)->fXMLNSNamespaceId;
      }
      else {
        uVar9 = this_00->fAttName->fURIId;
        pXVar18 = L"xmlns";
        if (pXVar13 == (XMLCh *)0x0) {
LAB_003440eb:
          if (*pXVar18 == L'\0') goto LAB_003440f1;
        }
        else {
          pXVar18 = L"xmlns";
          do {
            XVar2 = *pXVar13;
            if (XVar2 == L'\0') goto LAB_003440eb;
            pXVar13 = pXVar13 + 1;
            XVar3 = *pXVar18;
            pXVar18 = pXVar18 + 1;
          } while (XVar2 == XVar3);
        }
      }
      pXVar5 = (this->super_XercesDOMParser).super_AbstractDOMParser.fScanner;
      if (uVar9 == pXVar5->fEmptyNamespaceId) {
        pXVar13 = (XMLCh *)0x0;
      }
      else {
        pXVar13 = XMLScanner::getURIText(pXVar5,uVar9);
      }
      pDVar6 = (this->super_XercesDOMParser).super_AbstractDOMParser.fDocument;
      pXVar18 = XMLAttr::getQName(this_00);
      iVar8 = (*(pDVar6->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x53])
                        (pDVar6,pXVar13,pXVar18);
      attr = (DOMAttr *)CONCAT44(extraout_var_02,iVar8);
      (*(attr->super_DOMNode)._vptr_DOMNode[0x2b])(attr,this_00->fValue);
      iVar8 = (*local_58->_vptr_DOMNode[0x34])(local_58,attr);
      plVar10 = (long *)CONCAT44(extraout_var_03,iVar8);
      if (plVar10 != (long *)0x0) {
        (**(code **)(*plVar10 + 0x138))(plVar10);
      }
      if (this_00->fType == ID) {
        pDVar6 = (this->super_XercesDOMParser).super_AbstractDOMParser.fDocument;
        if (pDVar6->fNodeIDMap == (DOMNodeIDMap *)0x0) {
          iVar8 = (*(pDVar6->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])(pDVar6,0x30);
          pDVar6 = (this->super_XercesDOMParser).super_AbstractDOMParser.fDocument;
          doc = &pDVar6->super_DOMDocument;
          if (pDVar6 == (DOMDocumentImpl *)0x0) {
            doc = (DOMDocument *)0x0;
          }
          DOMNodeIDMap::DOMNodeIDMap((DOMNodeIDMap *)CONCAT44(extraout_var_04,iVar8),500,doc);
          ((this->super_XercesDOMParser).super_AbstractDOMParser.fDocument)->fNodeIDMap =
               (DOMNodeIDMap *)CONCAT44(extraout_var_04,iVar8);
        }
        DOMNodeIDMap::add(((this->super_XercesDOMParser).super_AbstractDOMParser.fDocument)->
                          fNodeIDMap,attr);
        *(ushort *)&attr[5].super_DOMNode._vptr_DOMNode =
             *(ushort *)&attr[5].super_DOMNode._vptr_DOMNode | 0x100;
      }
      (*(attr->super_DOMNode)._vptr_DOMNode[0x33])(attr,(ulong)this_00->fSpecified);
      XVar21 = XVar21 + 1;
    } while (XVar21 != attrCount);
  }
  iVar8 = (*(elemDecl->super_XSerializable)._vptr_XSerializable[7])();
  if ((char)iVar8 != '\0') {
    iVar8 = (*(elemDecl->super_XSerializable)._vptr_XSerializable[5])();
    plVar10 = (long *)CONCAT44(extraout_var_05,iVar8);
    lVar11 = (**(code **)(*plVar10 + 0x50))(plVar10);
    if (lVar11 != 0) {
      pXVar1 = &(this->super_XercesDOMParser).super_AbstractDOMParser.fBufMgr;
      uVar20 = 0;
      do {
        plVar12 = (long *)(**(code **)(*plVar10 + 0x58))(plVar10,uVar20);
        if (*(uint *)(plVar12 + 1) < 2) {
          pXVar13 = (XMLCh *)(**(code **)(*plVar12 + 0x28))();
          pXVar14 = XMLBufferMgr::bidOnBuffer(pXVar1);
          local_3c = -1;
          uVar9 = XMLScanner::resolveQName
                            ((this->super_XercesDOMParser).super_AbstractDOMParser.fScanner,pXVar13,
                             pXVar14,Mode_Attribute,&local_3c);
          if (pXVar13 == L"xmlns") {
LAB_003442c4:
            uVar9 = ((this->super_XercesDOMParser).super_AbstractDOMParser.fScanner)->
                    fXMLNSNamespaceId;
          }
          else {
            pXVar18 = L"xmlns";
            pXVar19 = pXVar13;
            if (pXVar13 == (XMLCh *)0x0) {
LAB_003442be:
              if (*pXVar18 == L'\0') goto LAB_003442c4;
            }
            else {
              do {
                XVar2 = *pXVar19;
                if (XVar2 == L'\0') goto LAB_003442be;
                XVar3 = *pXVar18;
                pXVar18 = pXVar18 + 1;
                pXVar19 = pXVar19 + 1;
              } while (XVar2 == XVar3);
            }
          }
          pXVar5 = (this->super_XercesDOMParser).super_AbstractDOMParser.fScanner;
          if (uVar9 == pXVar5->fEmptyNamespaceId) {
            pXVar18 = (XMLCh *)0x0;
          }
          else {
            pXVar18 = XMLScanner::getURIText(pXVar5,uVar9);
          }
          pDVar6 = (this->super_XercesDOMParser).super_AbstractDOMParser.fDocument;
          iVar8 = (*(pDVar6->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x53])
                            (pDVar6,pXVar18,pXVar13);
          plVar15 = (long *)CONCAT44(extraout_var_06,iVar8);
          iVar8 = (*local_58->_vptr_DOMNode[0x49])(local_58,plVar15);
          plVar16 = (long *)CONCAT44(extraout_var_07,iVar8);
          if (plVar16 != (long *)0x0) {
            (**(code **)(*plVar16 + 0x138))(plVar16);
          }
          if (plVar12[4] != 0) {
            (**(code **)(*plVar15 + 0x158))(plVar15);
            (**(code **)(*plVar15 + 0x198))(plVar15,0);
          }
          XMLBufferMgr::releaseBuffer(pXVar1,pXVar14);
        }
        (**(code **)(*plVar12 + 0x30))();
        uVar20 = uVar20 + 1;
        uVar17 = (**(code **)(*plVar10 + 0x50))(plVar10);
      } while (uVar20 < uVar17);
    }
  }
  pDVar7 = (this->super_XercesDOMParser).super_AbstractDOMParser.fCurrentParent;
  (*pDVar7->_vptr_DOMNode[0x11])(pDVar7,local_58);
  (this->super_XercesDOMParser).super_AbstractDOMParser.fCurrentParent = local_58;
  (this->super_XercesDOMParser).super_AbstractDOMParser.fCurrentNode = local_58;
  (this->super_XercesDOMParser).super_AbstractDOMParser.fWithinElement = true;
  elemPrefix = local_38;
joined_r0x003443ab:
  if (isEmpty) {
    (*(this->super_XercesDOMParser).super_AbstractDOMParser.super_XMLDocumentHandler.
      _vptr_XMLDocumentHandler[6])(this,elemDecl,(ulong)urlId,(ulong)isRoot,elemPrefix);
  }
  return;
}

Assistant:

void XSDDOMParser::startElement( const XMLElementDecl&       elemDecl
                               , const unsigned int          urlId
                               , const XMLCh* const          elemPrefix
                               , const RefVectorOf<XMLAttr>& attrList
                               , const XMLSize_t             attrCount
                               , const bool                  isEmpty
                               , const bool                  isRoot)
{
    fDepth++;

    // while it is true that non-whitespace character data
    // may only occur in appInfo or documentation
    // elements, it's certainly legal for comments and PI's to
    // occur as children of annotation; we need
    // to account for these here.
    if (fAnnotationDepth == -1)
    {
        if (XMLString::equals(elemDecl.getBaseName(), SchemaSymbols::fgELT_ANNOTATION) &&
            XMLString::equals(getURIText(urlId), SchemaSymbols::fgURI_SCHEMAFORSCHEMA))
        {

            fAnnotationDepth = fDepth;
            startAnnotation(elemDecl, attrList, attrCount);
        }
    }
    else if (fDepth == fAnnotationDepth+1)
    {
        fInnerAnnotationDepth = fDepth;
        startAnnotationElement(elemDecl, attrList, attrCount);
    }
    else
    {
        startAnnotationElement(elemDecl, attrList, attrCount);
        if(isEmpty)
            endElement(elemDecl, urlId, isRoot, elemPrefix);
        // avoid falling through; don't call startElement in this case
        return;
    }

    DOMElement *elem;
    if (urlId != fScanner->getEmptyNamespaceId())  //TagName has a prefix
    {
        if (elemPrefix && *elemPrefix)
        {
            XMLBufBid elemQName(&fBufMgr);
            elemQName.set(elemPrefix);
            elemQName.append(chColon);
            elemQName.append(elemDecl.getBaseName());
            elem = createElementNSNode(
                fScanner->getURIText(urlId), elemQName.getRawBuffer());
        }
        else {
            elem = createElementNSNode(
                fScanner->getURIText(urlId), elemDecl.getBaseName());
        }
    }
    else {
        elem = createElementNSNode(0, elemDecl.getBaseName());
    }

    DOMElementImpl *elemImpl = (DOMElementImpl *) elem;
    for (XMLSize_t index = 0; index < attrCount; ++index)
    {
        const XMLAttr* oneAttrib = attrList.elementAt(index);
        unsigned int attrURIId = oneAttrib->getURIId();
        const XMLCh* namespaceURI = 0;

        //for xmlns=...
        if (XMLString::equals(oneAttrib->getName(), XMLUni::fgXMLNSString))
            attrURIId = fScanner->getXMLNSNamespaceId();

        //TagName has a prefix
        if (attrURIId != fScanner->getEmptyNamespaceId())
            namespaceURI = fScanner->getURIText(attrURIId); //get namespaceURI

        //  revisit.  Optimize to init the named node map to the
        //            right size up front.
        DOMAttrImpl *attr = (DOMAttrImpl *)
            fDocument->createAttributeNS(namespaceURI, oneAttrib->getQName());
        attr->setValue(oneAttrib -> getValue());
        DOMNode* remAttr = elemImpl->setAttributeNodeNS(attr);
        if (remAttr)
            remAttr->release();

        // Attributes of type ID.  If this is one, add it to the hashtable of IDs
        //   that is constructed for use by GetElementByID().
        if (oneAttrib->getType()==XMLAttDef::ID)
        {
            if (fDocument->fNodeIDMap == 0)
                fDocument->fNodeIDMap = new (fDocument) DOMNodeIDMap(500, fDocument);
            fDocument->fNodeIDMap->add(attr);
            attr->fNode.isIdAttr(true);
        }

        attr->setSpecified(oneAttrib->getSpecified());
    }

    // set up the default attributes
    if (elemDecl.hasAttDefs())
	{
        XMLAttDefList* defAttrs = &elemDecl.getAttDefList();
        XMLAttDef* attr = 0;
        DOMAttrImpl * insertAttr = 0;

        for (XMLSize_t i=0; i<defAttrs->getAttDefCount(); i++)
        {
            attr = &defAttrs->getAttDef(i);

            const XMLAttDef::DefAttTypes defType = attr->getDefaultType();
            if ((defType == XMLAttDef::Default)
            ||  (defType == XMLAttDef::Fixed))
            {
                // DOM Level 2 wants all namespace declaration attributes
                // to be bound to "http://www.w3.org/2000/xmlns/"
                // So as long as the XML parser doesn't do it, it needs to
                // done here.
                const XMLCh* qualifiedName = attr->getFullName();
                XMLBufBid bbPrefixQName(&fBufMgr);
                XMLBuffer& prefixBuf = bbPrefixQName.getBuffer();
                int colonPos = -1;
                unsigned int uriId = fScanner->resolveQName(qualifiedName, prefixBuf, ElemStack::Mode_Attribute, colonPos);

                const XMLCh* namespaceURI = 0;
                if (XMLString::equals(qualifiedName, XMLUni::fgXMLNSString))
                    uriId = fScanner->getXMLNSNamespaceId();

                //TagName has a prefix
                if (uriId != fScanner->getEmptyNamespaceId())
                    namespaceURI = fScanner->getURIText(uriId);

                insertAttr = (DOMAttrImpl *) fDocument->createAttributeNS(
                    namespaceURI, qualifiedName);

                DOMAttr* remAttr = elemImpl->setDefaultAttributeNodeNS(insertAttr);
                if (remAttr)
                    remAttr->release();

                if (attr->getValue() != 0)
                {
                    insertAttr->setValue(attr->getValue());
                    insertAttr->setSpecified(false);
                }
            }

            insertAttr = 0;
            attr->reset();
        }
    }

    fCurrentParent->appendChild(elem);
    fCurrentParent = elem;
    fCurrentNode = elem;
    fWithinElement = true;

    // If an empty element, do end right now (no endElement() will be called)
    if (isEmpty)
        endElement(elemDecl, urlId, isRoot, elemPrefix);
}